

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::settle(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
         *this)

{
  iterator_range<std::_List_iterator<char>_> *piVar1;
  __normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>
  _Var2;
  
  _Var2 = std::
          __remove_if<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,__gnu_cxx::__ops::_Iter_pred<burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,std::greater<void>>::remove_empty_ranges()::_lambda(auto:1_const&)_1_>>
                    ((this->m_begin)._M_current,(this->m_end)._M_current);
  (this->m_end)._M_current = _Var2._M_current;
  piVar1 = (this->m_begin)._M_current;
  if ((ulong)((long)_Var2._M_current - (long)piVar1 >> 4) < this->m_min_items) {
    (this->m_end)._M_current = piVar1;
    return;
  }
  maintain_invariant(this);
  next_semiintersection(this);
  return;
}

Assistant:

void settle ()
        {
            remove_empty_ranges();
            if (range_count() >= m_min_items)
            {
                maintain_invariant();
                next_semiintersection();
            }
            else
            {
                scroll_to_end();
            }
        }